

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_concat.cpp
# Opt level: O0

vector<duckdb::Value,_true> *
duckdb::GetListEntries(vector<duckdb::Value,_true> *keys,vector<duckdb::Value,_true> *values)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  *pvVar1;
  pair<const_char_*,_duckdb::Value> *__args;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *in_RSI;
  vector<duckdb::Value,_true> *in_RDI;
  child_list_t<Value> children;
  idx_t i;
  vector<duckdb::Value,_true> *entries;
  value_type *in_stack_fffffffffffffe88;
  reference in_stack_fffffffffffffe90;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  *this;
  value_type local_138 [24];
  Value local_120 [248];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0xd9c8a3);
  local_28 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
              *)0x0;
  while (this = local_28,
        pvVar1 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                  *)std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::size(in_RSI),
        this < pvVar1) {
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
              *)0xd9c8e4);
    __args = (pair<const_char_*,_duckdb::Value> *)
             vector<duckdb::Value,_true>::operator[]
                       ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffe90,
                        (size_type)in_stack_fffffffffffffe88);
    std::make_pair<char_const(&)[4],duckdb::Value>((char (*) [4])__args,in_stack_fffffffffffffe90);
    std::
    vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
    ::emplace_back<std::pair<char_const*,duckdb::Value>>(this,__args);
    std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0xd9c93c);
    in_stack_fffffffffffffe90 =
         vector<duckdb::Value,_true>::operator[]
                   ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffe90,
                    (size_type)in_stack_fffffffffffffe88);
    std::make_pair<char_const(&)[6],duckdb::Value>((char (*) [6])__args,in_stack_fffffffffffffe90);
    std::
    vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
    ::emplace_back<std::pair<char_const*,duckdb::Value>>(this,__args);
    std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0xd9c994);
    in_stack_fffffffffffffe88 = local_138;
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
              *)in_stack_fffffffffffffe90,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
              *)in_stack_fffffffffffffe88);
    duckdb::Value::STRUCT(local_120,in_stack_fffffffffffffe88);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    duckdb::Value::~Value(local_120);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
               *)0xd9c9df);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
               *)0xd9c9ec);
    local_28 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)((long)&(local_28->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return in_RDI;
}

Assistant:

vector<Value> GetListEntries(vector<Value> keys, vector<Value> values) {
	D_ASSERT(keys.size() == values.size());
	vector<Value> entries;
	for (idx_t i = 0; i < keys.size(); i++) {
		child_list_t<Value> children;
		children.emplace_back(make_pair("key", std::move(keys[i])));
		children.emplace_back(make_pair("value", std::move(values[i])));
		entries.push_back(Value::STRUCT(std::move(children)));
	}
	return entries;
}